

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::GlobDirs
               (string *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  unsigned_long uVar4;
  char *pcVar5;
  bool local_13a;
  char *local_108;
  char local_f9;
  undefined1 local_f8 [8];
  string fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  uint local_84;
  Status SStack_80;
  uint i;
  Directory local_78;
  Directory d;
  string local_60 [8];
  string finishPath;
  string startPath;
  size_type pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *path_local;
  
  lVar2 = std::__cxx11::string::find((char *)path,0x103a5b4);
  if (lVar2 == -1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(files,path);
  }
  else {
    std::__cxx11::string::substr((ulong)((long)&finishPath.field_2 + 8),(ulong)path);
    std::__cxx11::string::substr((ulong)local_60,(ulong)path);
    cmsys::Directory::Directory(&local_78);
    SStack_80 = cmsys::Directory::Load
                          (&local_78,(string *)((long)&finishPath.field_2 + 8),(string *)0x0);
    bVar1 = cmsys::Status::operator_cast_to_bool(&stack0xffffffffffffff80);
    if (bVar1) {
      for (local_84 = 0; uVar3 = (ulong)local_84,
          uVar4 = cmsys::Directory::GetNumberOfFiles(&local_78), uVar3 < uVar4;
          local_84 = local_84 + 1) {
        fname.field_2._M_local_buf[0xe] = '\0';
        fname.field_2._M_local_buf[0xd] = '\0';
        pcVar5 = cmsys::Directory::GetFile(&local_78,(ulong)local_84);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar5,&local_a9);
        bVar1 = std::operator!=(&local_a8,".");
        local_13a = false;
        if (bVar1) {
          pcVar5 = cmsys::Directory::GetFile(&local_78,(ulong)local_84);
          std::allocator<char>::allocator();
          fname.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,pcVar5,
                     (allocator<char> *)(fname.field_2._M_local_buf + 0xf));
          fname.field_2._M_local_buf[0xd] = '\x01';
          local_13a = std::operator!=(&local_d0,"..");
        }
        if ((fname.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_d0);
        }
        if ((fname.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
        }
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator(&local_a9);
        if (local_13a != false) {
          local_f9 = '/';
          local_108 = cmsys::Directory::GetFile(&local_78,(ulong)local_84);
          cmStrCat<std::__cxx11::string&,char,char_const*>
                    ((string *)local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&finishPath.field_2 + 8),&local_f9,&local_108);
          bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_f8);
          if (bVar1) {
            std::__cxx11::string::operator+=((string *)local_f8,local_60);
            GlobDirs((string *)local_f8,files);
          }
          std::__cxx11::string::~string((string *)local_f8);
        }
      }
    }
    cmsys::Directory::~Directory(&local_78);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string((string *)(finishPath.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmSystemTools::GlobDirs(const std::string& path,
                             std::vector<std::string>& files)
{
  std::string::size_type pos = path.find("/*");
  if (pos == std::string::npos) {
    files.push_back(path);
    return;
  }
  std::string startPath = path.substr(0, pos);
  std::string finishPath = path.substr(pos + 2);

  cmsys::Directory d;
  if (d.Load(startPath)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = cmStrCat(startPath, '/', d.GetFile(i));
        if (cmSystemTools::FileIsDirectory(fname)) {
          fname += finishPath;
          cmSystemTools::GlobDirs(fname, files);
        }
      }
    }
  }
}